

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolutiondepthwise.cpp
# Opt level: O0

int __thiscall
ncnn::ConvolutionDepthWise::forward
          (ConvolutionDepthWise *this,vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *bottom_blobs,
          vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *top_blobs,Option *opt)

{
  undefined1 uVar1;
  bool bVar2;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *in_RDX;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *in_RSI;
  long in_RDI;
  int ret;
  int outh;
  int outw;
  int kernel_extent_h;
  int kernel_extent_w;
  size_t elemsize;
  int h;
  int w;
  Mat bottom_blob_bordered;
  Mat *_bias_data;
  Mat bias_data_flattened;
  Mat weight_data_flattened;
  int _num_output;
  int _kernel_h;
  int _kernel_w;
  Mat *top_blob;
  Mat *_weight_data;
  Mat *bottom_blob;
  undefined4 in_stack_fffffffffffffe20;
  undefined4 in_stack_fffffffffffffe24;
  undefined4 in_stack_fffffffffffffe28;
  undefined4 in_stack_fffffffffffffe2c;
  int in_stack_fffffffffffffe34;
  int in_stack_fffffffffffffe38;
  int in_stack_fffffffffffffe3c;
  undefined4 in_stack_fffffffffffffe40;
  undefined4 in_stack_fffffffffffffe44;
  Option *in_stack_fffffffffffffe50;
  Mat *in_stack_fffffffffffffe58;
  undefined4 in_stack_fffffffffffffe60;
  undefined1 in_stack_fffffffffffffe64;
  undefined1 in_stack_fffffffffffffe65;
  undefined1 in_stack_fffffffffffffe66;
  undefined1 in_stack_fffffffffffffe67;
  Mat local_158;
  const_reference local_110;
  Option *in_stack_ffffffffffffff30;
  int in_stack_ffffffffffffff38;
  int in_stack_ffffffffffffff3c;
  undefined4 in_stack_ffffffffffffff40;
  undefined4 in_stack_ffffffffffffff44;
  Mat *in_stack_ffffffffffffff48;
  ConvolutionDepthWise *in_stack_ffffffffffffff50;
  int local_1c;
  
  std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[](in_RSI,0);
  std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[](in_RSI,1);
  std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[](in_RDX,0);
  ncnn::Mat::Mat((Mat *)&stack0xffffffffffffff50);
  flatten((Mat *)CONCAT17(in_stack_fffffffffffffe67,
                          CONCAT16(in_stack_fffffffffffffe66,
                                   CONCAT15(in_stack_fffffffffffffe65,
                                            CONCAT14(in_stack_fffffffffffffe64,
                                                     in_stack_fffffffffffffe60)))),
          in_stack_fffffffffffffe58,in_stack_fffffffffffffe50);
  uVar1 = ncnn::Mat::empty((Mat *)CONCAT44(in_stack_fffffffffffffe24,in_stack_fffffffffffffe20));
  if ((bool)uVar1) {
    local_1c = -100;
    goto LAB_0060ef84;
  }
  ncnn::Mat::Mat((Mat *)&stack0xfffffffffffffef8);
  if (*(int *)(in_RDI + 0x100) == 0) {
LAB_0060ecdd:
    ncnn::Mat::Mat(&local_158);
    make_padding(in_stack_ffffffffffffff50,in_stack_ffffffffffffff48,
                 (Mat *)CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40),
                 in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38,in_stack_ffffffffffffff30);
    bVar2 = ncnn::Mat::empty((Mat *)CONCAT44(in_stack_fffffffffffffe24,in_stack_fffffffffffffe20));
    if (bVar2) {
      local_1c = -100;
    }
    else {
      ncnn::Mat::create((Mat *)CONCAT44(in_stack_fffffffffffffe44,in_stack_fffffffffffffe40),
                        in_stack_fffffffffffffe3c,in_stack_fffffffffffffe38,
                        in_stack_fffffffffffffe34,
                        CONCAT44(in_stack_fffffffffffffe2c,in_stack_fffffffffffffe28),
                        (Allocator *)CONCAT44(in_stack_fffffffffffffe24,in_stack_fffffffffffffe20));
      bVar2 = ncnn::Mat::empty((Mat *)CONCAT44(in_stack_fffffffffffffe24,in_stack_fffffffffffffe20))
      ;
      if (bVar2) {
        local_1c = -100;
      }
      else {
        local_1c = convolutiondepthwise
                             ((Mat *)bottom_blob_bordered.cstep,(Mat *)bottom_blob_bordered._56_8_,
                              (Mat *)bottom_blob_bordered._48_8_,(Mat *)bottom_blob_bordered._40_8_,
                              bottom_blob_bordered.allocator._4_4_,
                              (int)bottom_blob_bordered.allocator,
                              (int)weight_data_flattened.refcount,
                              (int)weight_data_flattened.elemsize,weight_data_flattened.elempack,
                              (int)weight_data_flattened.allocator,weight_data_flattened.dims,
                              weight_data_flattened.h,(Mat *)weight_data_flattened._56_8_,
                              (Option *)weight_data_flattened.cstep);
        if (local_1c == 0) {
          local_1c = 0;
        }
      }
    }
    ncnn::Mat::~Mat((Mat *)0x60ef66);
  }
  else {
    local_110 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[](in_RSI,2);
    flatten((Mat *)CONCAT17(uVar1,CONCAT16(in_stack_fffffffffffffe66,
                                           CONCAT15(in_stack_fffffffffffffe65,
                                                    CONCAT14(in_stack_fffffffffffffe64,
                                                             in_stack_fffffffffffffe60)))),
            in_stack_fffffffffffffe58,in_stack_fffffffffffffe50);
    bVar2 = ncnn::Mat::empty((Mat *)CONCAT44(in_stack_fffffffffffffe24,in_stack_fffffffffffffe20));
    if (!bVar2) goto LAB_0060ecdd;
    local_1c = -100;
  }
  ncnn::Mat::~Mat((Mat *)0x60ef73);
LAB_0060ef84:
  ncnn::Mat::~Mat((Mat *)0x60ef91);
  return local_1c;
}

Assistant:

int ConvolutionDepthWise::forward(const std::vector<Mat>& bottom_blobs, std::vector<Mat>& top_blobs, const Option& opt) const
{
    const Mat& bottom_blob = bottom_blobs[0];
    const Mat& _weight_data = bottom_blobs[1];
    Mat& top_blob = top_blobs[0];

    const int _kernel_w = _weight_data.w;
    const int _kernel_h = _weight_data.h;
    const int _num_output = _weight_data.c;

    Mat weight_data_flattened;
    flatten(_weight_data, weight_data_flattened, opt);
    if (weight_data_flattened.empty())
        return -100;

    Mat bias_data_flattened;
    if (bias_term)
    {
        const Mat& _bias_data = bottom_blobs[2];
        flatten(_bias_data, bias_data_flattened, opt);
        if (bias_data_flattened.empty())
            return -100;
    }

    Mat bottom_blob_bordered;
    make_padding(bottom_blob, bottom_blob_bordered, _kernel_w, _kernel_h, opt);
    if (bottom_blob_bordered.empty())
        return -100;

    const int w = bottom_blob_bordered.w;
    const int h = bottom_blob_bordered.h;
    const size_t elemsize = bottom_blob_bordered.elemsize;

    const int kernel_extent_w = dilation_w * (_kernel_w - 1) + 1;
    const int kernel_extent_h = dilation_h * (_kernel_h - 1) + 1;

    const int outw = (w - kernel_extent_w) / stride_w + 1;
    const int outh = (h - kernel_extent_h) / stride_h + 1;

    top_blob.create(outw, outh, _num_output, elemsize, opt.blob_allocator);
    if (top_blob.empty())
        return -100;

    int ret = convolutiondepthwise(bottom_blob_bordered, top_blob, weight_data_flattened, bias_data_flattened, _kernel_w, _kernel_h, stride_w, stride_h, dilation_w, dilation_h, group, activation_type, activation_params, opt);
    if (ret != 0)
        return ret;

    return 0;
}